

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O2

int mg_session_read_uint32(mg_session *session,uint32_t *val)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = session->in_cursor + 4;
  if (session->in_end < uVar1) {
    mg_session_set_error(session,"unexpected end of message");
    return -6;
  }
  uVar2 = *(uint *)(session->in_buffer + session->in_cursor);
  *val = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  session->in_cursor = uVar1;
  return 0;
}

Assistant:

int mg_session_read_uint32(mg_session *session, uint32_t *val) {
  if (session->in_cursor + 4 > session->in_end) {
    mg_session_set_error(session, "unexpected end of message");
    return MG_ERROR_DECODING_FAILED;
  }
  *val = be32toh(*(uint32_t *)(session->in_buffer + session->in_cursor));
  session->in_cursor += 4;
  return 0;
}